

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean dump_buffer_s(working_state *state)

{
  jpeg_destination_mgr *pjVar1;
  boolean bVar2;
  
  pjVar1 = state->cinfo->dest;
  bVar2 = (*pjVar1->empty_output_buffer)(state->cinfo);
  if (bVar2 != 0) {
    state->next_output_byte = pjVar1->next_output_byte;
    state->free_in_buffer = pjVar1->free_in_buffer;
  }
  return (uint)(bVar2 != 0);
}

Assistant:

LOCAL(boolean)
dump_buffer_s (working_state * state)
/* Empty the output buffer; return TRUE if successful, FALSE if must suspend */
{
  struct jpeg_destination_mgr * dest = state->cinfo->dest;

  if (! (*dest->empty_output_buffer) (state->cinfo))
    return FALSE;
  /* After a successful buffer dump, must reset buffer pointers */
  state->next_output_byte = dest->next_output_byte;
  state->free_in_buffer = dest->free_in_buffer;
  return TRUE;
}